

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_b576ef::SourceLineSynchronizer::syncToMostRecentString
          (SourceLineSynchronizer *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if ((this->getLastSourceIndex).super__Function_base._M_manager != (_Manager_type)0x0) {
    iVar2 = (*(this->getLastSourceIndex)._M_invoker)((_Any_data *)this);
    iVar1 = this->lastSource;
    if (iVar2 != iVar1) {
      if ((iVar1 != -1) || (this->lastLine != 0)) {
        std::__cxx11::string::push_back((char)this->output);
      }
      if ((this->getLastSourceIndex).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_00352802;
      iVar3 = (*(this->getLastSourceIndex)._M_invoker)((_Any_data *)this);
      this->lastSource = iVar3;
      this->lastLine = -1;
    }
    return iVar2 != iVar1;
  }
LAB_00352802:
  std::__throw_bad_function_call();
}

Assistant:

bool InitializeSymbolTable(const TString& builtIns, int version, EProfile profile, const SpvVersion& spvVersion, EShLanguage language,
                           EShSource source, TInfoSink& infoSink, TSymbolTable& symbolTable)
{
    TIntermediate intermediate(language, version, profile);

    intermediate.setSource(source);

    std::unique_ptr<TParseContextBase> parseContext(CreateParseContext(symbolTable, intermediate, version, profile, source,
                                                                       language, infoSink, spvVersion, true, EShMsgDefault,
                                                                       true));

    TShader::ForbidIncluder includer;
    TPpContext ppContext(*parseContext, "", includer);
    TScanContext scanContext(*parseContext);
    parseContext->setScanContext(&scanContext);
    parseContext->setPpContext(&ppContext);

    //
    // Push the symbol table to give it an initial scope.  This
    // push should not have a corresponding pop, so that built-ins
    // are preserved, and the test for an empty table fails.
    //

    symbolTable.push();

    const char* builtInShaders[2];
    size_t builtInLengths[2];
    builtInShaders[0] = builtIns.c_str();
    builtInLengths[0] = builtIns.size();

    if (builtInLengths[0] == 0)
        return true;

    TInputScanner input(1, builtInShaders, builtInLengths);
    if (! parseContext->parseShaderStrings(ppContext, input) != 0) {
        infoSink.info.message(EPrefixInternalError, "Unable to parse built-ins");
        printf("Unable to parse built-ins\n%s\n", infoSink.info.c_str());
        printf("%s\n", builtInShaders[0]);

        return false;
    }

    return true;
}